

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntFromDescriptor
          (ChLinkPointFrameGeneric *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  iVar2 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar2 != '\0') {
    iVar2 = 0;
    if ((this->c_x == true) &&
       ((this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)off_L) goto LAB_0061aabc;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[off_L] =
           (this->constraint1).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar2 = 1;
    }
    if ((this->c_y == true) &&
       ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      uVar1 = iVar2 + off_L;
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)uVar1) goto LAB_0061aabc;
      iVar2 = iVar2 + 1;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[uVar1] =
           (this->constraint2).super_ChConstraintTwo.super_ChConstraint.l_i;
    }
    if ((this->c_z == true) &&
       ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar2 + off_L)) {
LAB_0061aabc:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar2 + off_L] = (this->constraint3).super_ChConstraintTwo.super_ChConstraint.l_i;
    }
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntFromDescriptor(const unsigned int off_v,
                                                ChStateDelta& v,
                                                const unsigned int off_L,
                                                ChVectorDynamic<>& L) {
    if (!IsActive())
        return;

    int cnt = 0;
    if (c_x && this->constraint1.IsActive()) {
        L(off_L + cnt) = constraint1.Get_l_i();
        cnt++;
    }
    if (c_y && this->constraint2.IsActive()) {
        L(off_L + cnt) = constraint2.Get_l_i();
        cnt++;
    }
    if (c_z && this->constraint3.IsActive()) {
        L(off_L + cnt) = constraint3.Get_l_i();
        // cnt++;
    }
}